

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cc
# Opt level: O0

bool validate_fdb_config(fdb_config *fconfig)

{
  ushort *in_RDI;
  bool local_1;
  
  if (in_RDI != (ushort *)0x0) {
    if ((*in_RDI < 4) || (0x40 < *in_RDI)) {
      local_1 = false;
    }
    else if (*in_RDI < 8) {
      local_1 = false;
    }
    else if ((*(uint *)(in_RDI + 2) < 0x400) || (0x20000 < *(uint *)(in_RDI + 2))) {
      local_1 = false;
    }
    else if (((char)in_RDI[0x10] == '\0') || ((char)in_RDI[0x10] == '\x01')) {
      if ((((*(char *)((long)in_RDI + 0x21) == '\0') || (*(char *)((long)in_RDI + 0x21) == '\x01'))
          || (*(char *)((long)in_RDI + 0x21) == '\x02')) ||
         (*(char *)((long)in_RDI + 0x21) == '\x03')) {
        if (((*(uint *)(in_RDI + 0x12) & 1) == 0) || ((*(uint *)(in_RDI + 0x12) & 2) == 0)) {
          if (*(byte *)((long)in_RDI + 0x2f) < 0x65) {
            if (*(long *)(in_RDI + 0x1c) == 0) {
              local_1 = false;
            }
            else if ((in_RDI[0x28] == 0) || (0x200 < in_RDI[0x28])) {
              local_1 = false;
            }
            else if ((in_RDI[0x29] == 0) || (0x200 < in_RDI[0x29])) {
              local_1 = false;
            }
            else if ((*(ulong *)(in_RDI + 0x38) < 0x14) || (100 < *(ulong *)(in_RDI + 0x38))) {
              local_1 = false;
            }
            else if ((*(long *)(in_RDI + 0x3c) == 0) || (0x80 < *(ulong *)(in_RDI + 0x3c))) {
              local_1 = false;
            }
            else if (*(ulong *)(in_RDI + 0x44) < 0x41) {
              if (*(long *)(in_RDI + 0x68) == 0) {
                local_1 = false;
              }
              else if (*(ulong *)(in_RDI + 0x70) < 7) {
                local_1 = true;
              }
              else {
                local_1 = false;
              }
            }
            else {
              local_1 = false;
            }
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = false;
        }
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
    return local_1;
  }
  __assert_fail("fconfig",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/configuration.cc"
                ,0x91,"bool validate_fdb_config(fdb_config *)");
}

Assistant:

bool validate_fdb_config(fdb_config *fconfig) {
    assert(fconfig);

    if (fconfig->chunksize < 4 || fconfig->chunksize > 64) {
        // Chunk size should be set between 4 and 64 bytes.
        return false;
    }
    if (fconfig->chunksize < sizeof(void *)) {
        // Chunk size should be equal to or greater than the address bus size
        return false;
    }
    if (fconfig->blocksize < 1024 || fconfig->blocksize > 131072) {
        // Block size should be set between 1KB and 128KB
        return false;
    }
    if (fconfig->seqtree_opt != FDB_SEQTREE_NOT_USE &&
        fconfig->seqtree_opt != FDB_SEQTREE_USE) {
        return false;
    }
    if (fconfig->durability_opt != FDB_DRB_NONE &&
        fconfig->durability_opt != FDB_DRB_ODIRECT &&
        fconfig->durability_opt != FDB_DRB_ASYNC &&
        fconfig->durability_opt != FDB_DRB_ODIRECT_ASYNC) {
        return false;
    }
    if ((fconfig->flags & FDB_OPEN_FLAG_CREATE) &&
        (fconfig->flags & FDB_OPEN_FLAG_RDONLY)) {
        return false;
    }
    if (fconfig->compaction_threshold > 100) {
        // Compaction threshold should be equal or less then 100 (%).
        return false;
    }
    if (fconfig->compactor_sleep_duration == 0) {
        // Sleep duration should be larger than zero
        return false;
    }
    if (!fconfig->num_wal_partitions ||
        (fconfig->num_wal_partitions > MAX_NUM_WAL_PARTITIONS)) {
        return false;
    }
    if (!fconfig->num_bcache_partitions ||
        (fconfig->num_bcache_partitions > MAX_NUM_BCACHE_PARTITIONS)) {
        return false;
    }
    if (fconfig->max_writer_lock_prob < 20 ||
        fconfig->max_writer_lock_prob > 100) {
        return false;
    }
    if (fconfig->num_compactor_threads < 1 ||
        fconfig->num_compactor_threads > MAX_NUM_COMPACTOR_THREADS) {
        return false;
    }
    if (fconfig->num_bgflusher_threads > MAX_NUM_BGFLUSHER_THREADS) {
        return false;
    }
    if (fconfig->num_keeping_headers == 0) {
        // num_keeping_headers should be greater than zero
        return false;
    }
    if (fconfig->log_msg_level > 6) {
        // Log level: 0 to 6.
        return false;
    }

    return true;
}